

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonParseReset(JsonParse *pParse)

{
  if (pParse->bJsonIsRCStr != '\0') {
    sqlite3RCStrUnref(pParse->zJson);
    pParse->zJson = (char *)0x0;
    pParse->nJson = 0;
    pParse->bJsonIsRCStr = '\0';
  }
  if (pParse->nBlobAlloc != 0) {
    sqlite3DbFree(pParse->db,pParse->aBlob);
    pParse->aBlob = (u8 *)0x0;
    pParse->nBlob = 0;
    pParse->nBlobAlloc = 0;
  }
  return;
}

Assistant:

static void jsonParseReset(JsonParse *pParse){
  assert( pParse->nJPRef<=1 );
  if( pParse->bJsonIsRCStr ){
    sqlite3RCStrUnref(pParse->zJson);
    pParse->zJson = 0;
    pParse->nJson = 0;
    pParse->bJsonIsRCStr = 0;
  }
  if( pParse->nBlobAlloc ){
    sqlite3DbFree(pParse->db, pParse->aBlob);
    pParse->aBlob = 0;
    pParse->nBlob = 0;
    pParse->nBlobAlloc = 0;
  }
}